

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O1

bool duckdb::Time::TryConvertInternal
               (char *buf,idx_t len,idx_t *pos,dtime_t *result,bool strict,
               optional_ptr<int,_true> nanos)

{
  byte bVar1;
  ulong uVar2;
  idx_t iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  int32_t sec;
  int32_t min;
  uint local_58;
  uint local_54;
  ulong local_50;
  dtime_t *local_48;
  optional_ptr<int,_true> local_40;
  ulong local_38;
  
  local_54 = 0xffffffff;
  local_58 = 0xffffffff;
  *pos = 0;
  if (len == 0) {
    return false;
  }
  uVar7 = *pos;
  bVar9 = uVar7 < len;
  if (!bVar9) {
    return false;
  }
  while( true ) {
    uVar2 = uVar7 + 1;
    if ((4 < (byte)buf[uVar7] - 9) && (buf[uVar7] != 0x20)) break;
    *pos = uVar2;
    bVar9 = uVar2 < len;
    uVar7 = uVar2;
    if (uVar2 == len) {
      return false;
    }
  }
  if (!bVar9) {
    return false;
  }
  if (9 < (byte)(buf[uVar7] - 0x30U)) {
    return false;
  }
  uVar7 = *pos;
  bVar9 = uVar7 < len;
  if (!bVar9) {
    return false;
  }
  bVar1 = buf[uVar7];
  local_50 = 0;
  if ((byte)(bVar1 - 0x30) < 10) {
    iVar6 = -9;
    do {
      uVar7 = uVar7 + 1;
      if (iVar6 == 0) {
        return false;
      }
      *pos = uVar7;
      if (len == uVar7) {
        return false;
      }
      uVar8 = ((uint)bVar1 + (int)local_50 * 10) - 0x30;
      local_50 = (ulong)uVar8;
      bVar1 = buf[uVar7];
      iVar6 = iVar6 + 1;
    } while ((byte)(bVar1 - 0x30) < 10);
    bVar9 = uVar7 < len;
    local_50 = (long)(int)uVar8 * 0x3c;
  }
  if (!bVar9) {
    return false;
  }
  *pos = uVar7 + 1;
  if (buf[uVar7] != ':') {
    return false;
  }
  local_48 = result;
  local_40.ptr = nanos.ptr;
  if (uVar7 + 1 == len && !strict) {
    local_54 = 0;
  }
  else {
    local_38 = uVar7;
    bVar9 = Date::ParseDoubleDigit(buf,len,pos,(int32_t *)&local_54);
    if (!bVar9) {
      return false;
    }
    uVar7 = local_38;
    if (0x3b < local_54) {
      return false;
    }
  }
  uVar2 = *pos;
  if (len < uVar2) {
    return false;
  }
  if ((uVar2 != len) || (uVar7 + 3 != uVar2 && strict)) {
    *pos = uVar2 + 1;
    if (buf[uVar2] != ':') {
      return false;
    }
    if (uVar2 + 1 != len || strict) {
      bVar9 = Date::ParseDoubleDigit(buf,len,pos,(int32_t *)&local_58);
      if (!bVar9) {
        return false;
      }
      if (0x3b < local_58) {
        return false;
      }
      goto LAB_00dc8e46;
    }
  }
  local_58 = 0;
LAB_00dc8e46:
  uVar7 = *pos;
  iVar6 = 0;
  if ((uVar7 < len) && (iVar6 = 0, buf[uVar7] == '.')) {
    *pos = uVar7 + 1;
    iVar5 = 0;
    if (uVar7 + 1 < len) {
      iVar6 = 100000000;
      if (nanos.ptr == (int *)0x0) {
        iVar6 = 100000;
      }
      iVar5 = 0;
      iVar3 = uVar7 + 2;
      do {
        if (9 < (byte)(buf[iVar3 - 1] - 0x30U)) break;
        iVar4 = ((byte)buf[iVar3 - 1] - 0x30) * iVar6;
        if (iVar6 < 1) {
          iVar4 = 0;
        }
        iVar5 = iVar4 + iVar5;
        *pos = iVar3;
        iVar6 = iVar6 / 10;
        bVar9 = iVar3 != len;
        iVar3 = iVar3 + 1;
      } while (bVar9);
    }
    iVar6 = iVar5;
    if (nanos.ptr != (int *)0x0) {
      optional_ptr<int,_true>::CheckValid(&local_40);
      iVar6 = (int)(SUB168(SEXT816((long)iVar5) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
              (SUB164(SEXT816((long)iVar5) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f);
      *local_40.ptr = iVar5 + iVar6 * -1000;
    }
  }
  if (strict) {
    uVar7 = *pos;
    bVar9 = uVar7 < len;
    if (bVar9) {
      do {
        uVar2 = uVar7 + 1;
        if ((4 < (byte)buf[uVar7] - 9) && (buf[uVar7] != 0x20)) {
          if (bVar9) {
            return false;
          }
          break;
        }
        *pos = uVar2;
        bVar9 = uVar2 < len;
        uVar7 = uVar2;
      } while (uVar2 != len);
    }
  }
  local_48->micros =
       (long)iVar6 + ((local_50 + (long)(int)local_54) * 0x3c + (long)(int)local_58) * 1000000;
  return true;
}

Assistant:

bool Time::TryConvertInternal(const char *buf, idx_t len, idx_t &pos, dtime_t &result, bool strict,
                              optional_ptr<int32_t> nanos) {
	int32_t hour = -1, min = -1, sec = -1, micros = -1;
	pos = 0;

	if (len == 0) {
		return false;
	}

	int sep;

	// skip leading spaces
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
	}

	if (pos >= len) {
		return false;
	}

	if (!StringUtil::CharacterIsDigit(buf[pos])) {
		return false;
	}

	// Allow up to 9 digit hours to support intervals
	hour = 0;
	for (int32_t digits = 9; pos < len && StringUtil::CharacterIsDigit(buf[pos]); ++pos) {
		if (digits-- > 0) {
			hour = hour * 10 + (buf[pos] - '0');
		} else {
			return false;
		}
	}

	if (pos >= len) {
		return false;
	}

	// fetch the separator
	sep = buf[pos++];
	if (sep != ':') {
		// invalid separator
		return false;
	}
	idx_t sep_pos = pos;
	if (pos == len && !strict) {
		min = 0;
	} else {
		if (!Date::ParseDoubleDigit(buf, len, pos, min)) {
			return false;
		}
		if (min < 0 || min >= 60) {
			return false;
		}
	}

	if (pos > len) {
		return false;
	}
	if (pos == len && (!strict || sep_pos + 2 == pos)) {
		sec = 0;
	} else {
		if (buf[pos++] != sep) {
			return false;
		}

		if (pos == len && !strict) {
			sec = 0;
		} else {
			if (!Date::ParseDoubleDigit(buf, len, pos, sec)) {
				return false;
			}
			if (sec < 0 || sec >= 60) {
				return false;
			}
		}
	}

	micros = 0;
	if (pos < len && buf[pos] == '.') {
		pos++;
		// we expect some microseconds
		int32_t mult = 100000;
		if (nanos) {
			// do we expect nanoseconds?
			mult *= Interval::NANOS_PER_MICRO;
		}
		for (; pos < len && StringUtil::CharacterIsDigit(buf[pos]); pos++, mult /= 10) {
			if (mult > 0) {
				micros += (buf[pos] - '0') * mult;
			}
		}
		if (nanos) {
			*nanos = UnsafeNumericCast<int32_t>(micros % Interval::NANOS_PER_MICRO);
			micros /= Interval::NANOS_PER_MICRO;
		}
	}

	// in strict mode, check remaining string for non-space characters
	if (strict) {
		// skip trailing spaces
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		// check position. if end was not reached, non-space chars remaining
		if (pos < len) {
			return false;
		}
	}

	result = Time::FromTime(hour, min, sec, micros);
	return true;
}